

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addTorsion(Molecule *this,Torsion *torsion)

{
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  _Var1;
  Torsion *local_10;
  
  local_10 = torsion;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Torsion**,std::vector<OpenMD::Torsion*,std::allocator<OpenMD::Torsion*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Torsion*const>>
                    ((this->torsions_).
                     super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->torsions_).
                     super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::push_back
              (&this->torsions_,&local_10);
  }
  return;
}

Assistant:

void Molecule::addTorsion(Torsion* torsion) {
    if (std::find(torsions_.begin(), torsions_.end(), torsion) ==
        torsions_.end()) {
      torsions_.push_back(torsion);
    }
  }